

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * displayP4(Op *pOp,char *zTemp,int nTemp)

{
  KeyInfo *pKVar1;
  Mem *pMVar2;
  int *piVar3;
  int iVar4;
  char *pcVar5;
  CollSeq *local_b0;
  int n;
  int *ai;
  int i;
  sqlite3_vtab *pVtab;
  Mem *pMem;
  FuncDef *pDef;
  CollSeq *pColl_1;
  char *zColl;
  CollSeq *pColl;
  KeyInfo *pKeyInfo;
  undefined1 local_48 [4];
  int j;
  StrAccum x;
  char *zP4;
  int nTemp_local;
  char *zTemp_local;
  Op *pOp_local;
  
  x._24_8_ = zTemp;
  sqlite3StrAccumInit((StrAccum *)local_48,(sqlite3 *)0x0,zTemp,nTemp,0);
  switch(pOp->p4type) {
  case -0xffffff11:
  case -0xffffff05:
    *zTemp = '\0';
    break;
  default:
    x._24_8_ = (pOp->p4).p;
    if ((void *)x._24_8_ == (void *)0x0) {
      *zTemp = '\0';
      x._24_8_ = zTemp;
    }
    break;
  case -0xffffff0f:
    piVar3 = (pOp->p4).ai;
    iVar4 = *piVar3;
    for (ai._4_4_ = 1; ai._4_4_ <= iVar4; ai._4_4_ = ai._4_4_ + 1) {
      sqlite3_str_appendf((StrAccum *)local_48,",%d",(ulong)(uint)piVar3[ai._4_4_]);
    }
    *zTemp = '[';
    sqlite3_str_append((sqlite3_str *)local_48,"]",1);
    break;
  case -0xffffff0e:
    sqlite3_str_appendf((StrAccum *)local_48,"%lld",*(pOp->p4).pI64);
    break;
  case -0xffffff0d:
    sqlite3_str_appendf((StrAccum *)local_48,"%.16g",*(pOp->p4).pI64);
    break;
  case -0xffffff0c:
    sqlite3_str_appendf((StrAccum *)local_48,"vtab:%p",((pOp->p4).pFunc)->pNext);
    break;
  case -0xffffff0b:
    pMVar2 = (pOp->p4).pMem;
    if ((pMVar2->flags & 2) == 0) {
      if ((pMVar2->flags & 4) == 0) {
        if ((pMVar2->flags & 8) == 0) {
          if ((pMVar2->flags & 1) == 0) {
            x._24_8_ = anon_var_dwarf_1076f;
          }
          else {
            x._24_8_ = (long)"SELECT * FROM sqlite_master WHERE rootpage=0 OR rootpage IS NULL" +
                       0x3c;
          }
        }
        else {
          sqlite3_str_appendf((StrAccum *)local_48,"%.16g",(pMVar2->u).r);
        }
      }
      else {
        sqlite3_str_appendf((StrAccum *)local_48,"%lld",(pMVar2->u).r);
      }
    }
    else {
      x._24_8_ = pMVar2->z;
    }
    break;
  case -0xffffff09:
    pKVar1 = (pOp->p4).pKeyInfo;
    sqlite3_str_appendf((StrAccum *)local_48,"k(%d",(ulong)pKVar1->nKeyField);
    for (pKeyInfo._4_4_ = 0; pKeyInfo._4_4_ < (int)(uint)pKVar1->nKeyField;
        pKeyInfo._4_4_ = pKeyInfo._4_4_ + 1) {
      if (pKVar1->aColl[pKeyInfo._4_4_] == (CollSeq *)0x0) {
        local_b0 = (CollSeq *)0x2220dc;
      }
      else {
        local_b0 = (CollSeq *)pKVar1->aColl[pKeyInfo._4_4_]->zName;
      }
      pColl_1 = local_b0;
      iVar4 = strcmp((char *)local_b0,"BINARY");
      if (iVar4 == 0) {
        pColl_1 = (CollSeq *)0x23030e;
      }
      pcVar5 = "";
      if (pKVar1->aSortOrder[pKeyInfo._4_4_] != '\0') {
        pcVar5 = "-";
      }
      sqlite3_str_appendf((StrAccum *)local_48,",%s%s",pcVar5,pColl_1);
    }
    sqlite3_str_append((sqlite3_str *)local_48,")",1);
    break;
  case -0xffffff08:
    sqlite3_str_appendf((StrAccum *)local_48,"%s(%d)",((pOp->p4).pFunc)->zName,
                        (ulong)(uint)(int)((pOp->p4).pFunc)->nArg);
    break;
  case -0xffffff06:
    sqlite3_str_appendf((StrAccum *)local_48,"%s",*(pOp->p4).pI64);
    break;
  case -0xffffff04:
    sqlite3_str_appendf((StrAccum *)local_48,"program");
    break;
  case -0xffffff03:
    sqlite3_str_appendf((StrAccum *)local_48,"%d",(ulong)(uint)(pOp->p4).i);
    break;
  case -0xffffff02:
    sqlite3_str_appendf((StrAccum *)local_48,"(%.20s)",*(pOp->p4).pI64);
  }
  sqlite3StrAccumFinish((StrAccum *)local_48);
  return (char *)x._24_8_;
}

Assistant:

static char *displayP4(Op *pOp, char *zTemp, int nTemp){
  char *zP4 = zTemp;
  StrAccum x;
  assert( nTemp>=20 );
  sqlite3StrAccumInit(&x, 0, zTemp, nTemp, 0);
  switch( pOp->p4type ){
    case P4_KEYINFO: {
      int j;
      KeyInfo *pKeyInfo = pOp->p4.pKeyInfo;
      assert( pKeyInfo->aSortOrder!=0 );
      sqlite3_str_appendf(&x, "k(%d", pKeyInfo->nKeyField);
      for(j=0; j<pKeyInfo->nKeyField; j++){
        CollSeq *pColl = pKeyInfo->aColl[j];
        const char *zColl = pColl ? pColl->zName : "";
        if( strcmp(zColl, "BINARY")==0 ) zColl = "B";
        sqlite3_str_appendf(&x, ",%s%s", 
               pKeyInfo->aSortOrder[j] ? "-" : "", zColl);
      }
      sqlite3_str_append(&x, ")", 1);
      break;
    }
#ifdef SQLITE_ENABLE_CURSOR_HINTS
    case P4_EXPR: {
      displayP4Expr(&x, pOp->p4.pExpr);
      break;
    }
#endif
    case P4_COLLSEQ: {
      CollSeq *pColl = pOp->p4.pColl;
      sqlite3_str_appendf(&x, "(%.20s)", pColl->zName);
      break;
    }
    case P4_FUNCDEF: {
      FuncDef *pDef = pOp->p4.pFunc;
      sqlite3_str_appendf(&x, "%s(%d)", pDef->zName, pDef->nArg);
      break;
    }
#if defined(SQLITE_DEBUG) || defined(VDBE_PROFILE)
    case P4_FUNCCTX: {
      FuncDef *pDef = pOp->p4.pCtx->pFunc;
      sqlite3_str_appendf(&x, "%s(%d)", pDef->zName, pDef->nArg);
      break;
    }
#endif
    case P4_INT64: {
      sqlite3_str_appendf(&x, "%lld", *pOp->p4.pI64);
      break;
    }
    case P4_INT32: {
      sqlite3_str_appendf(&x, "%d", pOp->p4.i);
      break;
    }
    case P4_REAL: {
      sqlite3_str_appendf(&x, "%.16g", *pOp->p4.pReal);
      break;
    }
    case P4_MEM: {
      Mem *pMem = pOp->p4.pMem;
      if( pMem->flags & MEM_Str ){
        zP4 = pMem->z;
      }else if( pMem->flags & MEM_Int ){
        sqlite3_str_appendf(&x, "%lld", pMem->u.i);
      }else if( pMem->flags & MEM_Real ){
        sqlite3_str_appendf(&x, "%.16g", pMem->u.r);
      }else if( pMem->flags & MEM_Null ){
        zP4 = "NULL";
      }else{
        assert( pMem->flags & MEM_Blob );
        zP4 = "(blob)";
      }
      break;
    }
#ifndef SQLITE_OMIT_VIRTUALTABLE
    case P4_VTAB: {
      sqlite3_vtab *pVtab = pOp->p4.pVtab->pVtab;
      sqlite3_str_appendf(&x, "vtab:%p", pVtab);
      break;
    }
#endif
    case P4_INTARRAY: {
      int i;
      int *ai = pOp->p4.ai;
      int n = ai[0];   /* The first element of an INTARRAY is always the
                       ** count of the number of elements to follow */
      for(i=1; i<=n; i++){
        sqlite3_str_appendf(&x, ",%d", ai[i]);
      }
      zTemp[0] = '[';
      sqlite3_str_append(&x, "]", 1);
      break;
    }
    case P4_SUBPROGRAM: {
      sqlite3_str_appendf(&x, "program");
      break;
    }
    case P4_DYNBLOB:
    case P4_ADVANCE: {
      zTemp[0] = 0;
      break;
    }
    case P4_TABLE: {
      sqlite3_str_appendf(&x, "%s", pOp->p4.pTab->zName);
      break;
    }
    default: {
      zP4 = pOp->p4.z;
      if( zP4==0 ){
        zP4 = zTemp;
        zTemp[0] = 0;
      }
    }
  }
  sqlite3StrAccumFinish(&x);
  assert( zP4!=0 );
  return zP4;
}